

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O1

ssize_t __thiscall Pl_PNGFilter::write(Pl_PNGFilter *this,int __fd,void *__buf,size_t __n)

{
  void *in_RAX;
  undefined4 in_register_00000034;
  uchar *__s;
  void *__n_00;
  long lVar1;
  
  __n_00 = (void *)(this->incoming - this->pos);
  lVar1 = 0;
  if (__n_00 <= __buf) {
    do {
      memcpy(this->cur_row + this->pos,(void *)(CONCAT44(in_register_00000034,__fd) + lVar1),
             (size_t)__n_00);
      processRow(this);
      __s = this->prev_row;
      this->prev_row = this->cur_row;
      if (__s == (uchar *)0x0) {
        __s = (this->buf2).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      lVar1 = lVar1 + (long)__n_00;
      __buf = (void *)((long)__buf - (long)__n_00);
      this->cur_row = __s;
      in_RAX = memset(__s,0,(ulong)(this->bytes_per_row + 1));
      __n_00 = (void *)this->incoming;
      this->pos = 0;
    } while (__n_00 <= __buf);
  }
  if (__buf != (void *)0x0) {
    in_RAX = memcpy(this->cur_row + this->pos,(void *)(CONCAT44(in_register_00000034,__fd) + lVar1),
                    (size_t)__buf);
  }
  this->pos = this->pos + (long)__buf;
  return (ssize_t)in_RAX;
}

Assistant:

void
Pl_PNGFilter::write(unsigned char const* data, size_t len)
{
    size_t left = this->incoming - this->pos;
    size_t offset = 0;
    while (len >= left) {
        // finish off current row
        memcpy(this->cur_row + this->pos, data + offset, left);
        offset += left;
        len -= left;

        processRow();

        // Swap rows
        unsigned char* t = this->prev_row;
        this->prev_row = this->cur_row;
        this->cur_row = t ? t : this->buf2.get();
        memset(this->cur_row, 0, this->bytes_per_row + 1);
        left = this->incoming;
        this->pos = 0;
    }
    if (len) {
        memcpy(this->cur_row + this->pos, data + offset, len);
    }
    this->pos += len;
}